

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O1

bool __thiscall
Hpipe::Instruction::find_rec(Instruction *this,function<bool_(Hpipe::Instruction_*)> *f)

{
  pointer pTVar1;
  Instruction *this_00;
  bool bVar2;
  pointer pTVar3;
  bool bVar4;
  Instruction *local_58;
  _Any_data local_50;
  code *local_40;
  
  if (this->op_id == cur_op_id) {
    bVar4 = false;
  }
  else {
    this->op_id = cur_op_id;
    local_58 = this;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar2 = (*f->_M_invoker)((_Any_data *)f,&local_58);
    bVar4 = true;
    if (!bVar2) {
      pTVar3 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar1 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar4 = pTVar3 != pTVar1;
      if (bVar4) {
        do {
          this_00 = pTVar3->inst;
          std::function<bool_(Hpipe::Instruction_*)>::function
                    ((function<bool_(Hpipe::Instruction_*)> *)&local_50,f);
          bVar2 = find_rec(this_00,(function<bool_(Hpipe::Instruction_*)> *)&local_50);
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
          if (bVar2) {
            return bVar4;
          }
          pTVar3 = pTVar3 + 1;
          bVar4 = pTVar3 != pTVar1;
        } while (bVar4);
      }
    }
  }
  return bVar4;
}

Assistant:

bool Instruction::find_rec( std::function<bool (Instruction *)> f ) {
    if ( op_id == Instruction::cur_op_id )
        return false;
    op_id = Instruction::cur_op_id;

    if ( f( this ) )
        return true;

    for( Transition &t : next )
        if ( t.inst->find_rec( f ) )
            return true;
    return false;
}